

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strip_after_colon.cpp
# Opt level: O2

int main(void)

{
  size_type sVar1;
  ostream *poVar2;
  size_type sVar3;
  long lVar4;
  char *pcVar5;
  __const_iterator __first;
  string str;
  allocator<char> local_29;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"Hello World",&local_29);
  lVar4 = (long)local_28._M_string_length >> 2;
  sVar1 = local_28._M_string_length;
  do {
    sVar3 = sVar1;
    if (lVar4 < 1) {
      pcVar5 = local_28._M_dataplus._M_p + sVar3;
      if (sVar3 == 3) {
        __first._M_current = pcVar5;
        if (local_28._M_dataplus._M_p[2] == ':') goto LAB_00101310;
        pcVar5 = local_28._M_dataplus._M_p + 2;
LAB_001012fc:
        __first._M_current = pcVar5;
        if (pcVar5[-1] == ':') goto LAB_00101310;
        pcVar5 = pcVar5 + -1;
      }
      else {
        if (sVar3 == 2) goto LAB_001012fc;
        __first._M_current = local_28._M_dataplus._M_p;
        if (sVar3 != 1) goto LAB_00101310;
      }
      __first._M_current = local_28._M_dataplus._M_p;
      if (pcVar5[-1] == ':') {
        __first._M_current = pcVar5;
      }
      goto LAB_00101310;
    }
    if (local_28._M_dataplus._M_p[sVar3 - 1] == ':') {
      __first._M_current = local_28._M_dataplus._M_p + sVar3;
      goto LAB_00101310;
    }
    if (local_28._M_dataplus._M_p[sVar3 - 2] == ':') {
      __first._M_current = local_28._M_dataplus._M_p + (sVar3 - 1);
      goto LAB_00101310;
    }
    if (local_28._M_dataplus._M_p[sVar3 - 3] == ':') {
      __first._M_current = local_28._M_dataplus._M_p + (sVar3 - 2);
      goto LAB_00101310;
    }
    lVar4 = lVar4 + -1;
    sVar1 = sVar3 - 4;
  } while (local_28._M_dataplus._M_p[sVar3 - 4] != ':');
  __first._M_current = local_28._M_dataplus._M_p + (sVar3 - 3);
LAB_00101310:
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)&local_28);
  std::operator<<(poVar2,"\n");
  if (local_28._M_dataplus._M_p != __first._M_current) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              (&local_28,__first,
               (__const_iterator)(local_28._M_dataplus._M_p + local_28._M_string_length));
  }
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)&local_28);
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string((string *)&local_28);
  return 0;
}

Assistant:

int main() {
  string str = "Hello World";
  // Predicate
  auto isColon = [](int ch) { return ch == ':'; };
  // The last element satisfying the predicate or the first element if not found
  // Searching from the end backwards
  auto first = find_if(rbegin(str), rend(str), isColon);

  cout << str << "\n";

  // If found - delete everything after
  if (first != rend(str))
    str.erase(first.base(), end(str));

  cout << str << "\n";
}